

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_16x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  undefined1 in_CL;
  int size;
  int width_div16;
  int width_div8;
  int height;
  int width;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  TX_SIZE tx_size;
  __m256i out [32];
  __m256i in [32];
  int iVar3;
  int in_stack_fffffffffffff744;
  int in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  __m256i *in_stack_fffffffffffff750;
  int stride_00;
  int bit;
  int size_00;
  int in_stack_fffffffffffff7d4;
  int in_stack_fffffffffffff7d8;
  int8_t in_stack_fffffffffffff7df;
  __m256i *in_stack_fffffffffffff7e0;
  __m256i *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int8_t in_stack_fffffffffffffe37;
  __m256i *in_stack_fffffffffffffe38;
  __m256i *in_stack_fffffffffffffe40;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  __m256i *in_stack_ffffffffffffff78;
  int16_t *in_stack_ffffffffffffff80;
  
  iVar1 = get_txw_idx('\x02');
  iVar2 = get_txh_idx('\x02');
  size_00 = 0x10;
  bit = 0x10;
  stride_00 = 2;
  switch(in_CL) {
  case 0:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 1:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 2:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 3:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 4:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 5:
    iVar3 = 1;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 6:
    iVar3 = 1;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 7:
    iVar3 = 1;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 8:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 9:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 10:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 0xb:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fdct16_avx2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe37,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 0xc:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 0xd:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 0xe:
    iVar3 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
    break;
  case 0xf:
    iVar3 = 1;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               in_stack_fffffffffffff748);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    idtx16_avx2(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7df,
                in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar1,iVar2),size_00,bit,stride_00);
    fwd_txfm_transpose_16x16_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (__m256i *)CONCAT44(in_stack_fffffffffffff744,iVar3));
    fadst16_avx2((__m256i *)out[5][3],(__m256i *)out[5][2],out[5][1]._7_1_,(int)out[5][1],
                 out[5][0]._4_4_);
    store_buffer_avx2(in_stack_fffffffffffff750,
                      (int32_t *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                      in_stack_fffffffffffff744,iVar3);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m256i in[32], out[32];
  const TX_SIZE tx_size = TX_16X16;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const int width_div8 = (width >> 3);
  const int width_div16 = (width >> 4);
  const int size = (height << 1);
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case IDTX:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    default: assert(0);
  }
  (void)bd;
}